

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined8 uVar5;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  seq_t sequence_02;
  seq_t sequence_03;
  seq_t sequence_04;
  U32 i;
  ZSTD_litLocation_e ZVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  BYTE **ppBVar13;
  BYTE *pBVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  BYTE *pBVar19;
  int iVar20;
  int iVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  BYTE *oend_00;
  BYTE *oend_1;
  BYTE *pBVar24;
  BYTE *oend;
  ulong uVar25;
  BYTE *pBVar26;
  uint uVar27;
  BYTE *pBVar28;
  ulong *puVar29;
  BYTE *pBVar30;
  seq_t sequences [8];
  ulong local_248;
  ulong *local_240;
  BYTE *local_220;
  ulong local_218;
  BYTE *local_210;
  BYTE *local_208;
  BYTE *local_200;
  BYTE *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  BIT_DStream_t local_1d8;
  ZSTD_fseState local_1b0;
  ZSTD_fseState local_1a0;
  ZSTD_fseState local_190;
  BYTE *local_180 [3];
  ulong local_168;
  size_t sStack_160;
  BYTE *local_158;
  uint local_14c;
  ulong *local_148;
  BYTE *local_140;
  BYTE *local_138;
  ulong local_130;
  uint local_124;
  ulong *local_120;
  long local_118;
  long local_110;
  ZSTD_seqSymbol *local_108;
  ZSTD_seqSymbol *local_100;
  ulong auStack_f8 [25];
  
  if (dctx->bmi2 != 0) {
    sVar8 = ZSTD_decompressSequencesLong_bmi2
                      (dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar8;
  }
  ZVar6 = dctx->litBufferLocation;
  if (ZVar6 == ZSTD_in_dst) {
    oend_00 = dctx->litBuffer;
  }
  else {
    sVar8 = 0;
    if (0 < (long)maxDstSize) {
      sVar8 = maxDstSize;
    }
    oend_00 = (BYTE *)(sVar8 + (long)dst);
  }
  local_220 = dctx->litPtr;
  pBVar23 = dctx->litBufferEnd;
  pBVar22 = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_01d5dc77:
    pBVar19 = local_220;
    if (ZVar6 == ZSTD_split) {
      sVar17 = (long)pBVar23 - (long)local_220;
      if ((ulong)((long)oend_00 - (long)pBVar22) < sVar17) {
        return 0xffffffffffffffba;
      }
      if (pBVar22 == (BYTE *)0x0) {
        pBVar22 = (BYTE *)0x0;
      }
      else {
        memmove(pBVar22,local_220,sVar17);
        pBVar22 = pBVar22 + sVar17;
      }
      pBVar19 = dctx->litExtraBuffer;
      pBVar23 = dctx->litExtraBuffer + 0x10000;
    }
    sVar17 = (long)pBVar23 - (long)pBVar19;
    pBVar23 = (BYTE *)0xffffffffffffffba;
    if (sVar17 <= (ulong)((long)oend_00 - (long)pBVar22)) {
      if (pBVar22 == (BYTE *)0x0) {
        pBVar22 = (BYTE *)0x0;
      }
      else {
        memmove(pBVar22,pBVar19,sVar17);
        pBVar22 = pBVar22 + sVar17;
      }
      pBVar23 = pBVar22 + -(long)dst;
    }
  }
  else {
    pBVar19 = (BYTE *)dctx->prefixStart;
    local_200 = (BYTE *)dctx->virtualStart;
    local_210 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar9 = -0xc;
    do {
      *(ulong *)((long)&local_168 + lVar9 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar9);
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0);
    local_14c = 8;
    if (nbSeq < 8) {
      local_14c = nbSeq;
    }
    if (seqSize != 0) {
      local_1d8.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_1d8.bitContainer = (BitContainerType)*seqStart;
        switch(seqSize) {
        case 7:
          local_1d8.bitContainer =
               local_1d8.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_1d8.bitContainer =
               local_1d8.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_1d8.bitContainer =
               local_1d8.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_1d8.bitContainer =
               local_1d8.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_1d8.bitContainer =
               local_1d8.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_1d8.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_1d8.bitContainer;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar1 != 0) {
          uVar27 = 0x1f;
          if (bVar1 != 0) {
            for (; bVar1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
            }
          }
          local_1d8.bitsConsumed = (uVar27 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_1d8.ptr = (char *)seqStart;
LAB_01d5dd57:
          local_1f8 = pBVar23;
          local_1d8.start = (char *)seqStart;
          ZSTD_initFseState(&local_1b0,&local_1d8,dctx->LLTptr);
          ZSTD_initFseState(&local_1a0,&local_1d8,dctx->OFTptr);
          ZSTD_initFseState(&local_190,&local_1d8,dctx->MLTptr);
          if (nbSeq < 1) {
            uVar27 = 0;
          }
          else {
            local_248 = local_1d8.bitContainer;
            local_100 = local_190.table;
            local_108 = local_1a0.table;
            local_120 = (ulong *)local_1d8.limitPtr;
            local_208 = local_180[1];
            local_240 = (ulong *)local_1d8.ptr;
            local_110 = (ulong)local_14c * 0x18;
            local_118 = (ulong)(nbSeq - 1) * 0x18;
            lVar9 = 0;
            local_148 = (ulong *)local_1d8.start;
            puVar29 = local_148;
            pBVar23 = (BYTE *)local_1b0.state;
            pBVar28 = (BYTE *)local_1a0.state;
            sVar8 = local_190.state;
            uVar7 = local_1d8.bitsConsumed;
            do {
              local_180[1] = local_180[0];
              local_1f0 = (BYTE *)(ulong)local_190.table[sVar8].baseValue;
              uVar27 = local_1b0.table[(long)pBVar23].baseValue;
              uVar18 = (ulong)uVar27;
              bVar1 = local_1b0.table[(long)pBVar23].nbAdditionalBits;
              bVar11 = local_190.table[sVar8].nbAdditionalBits;
              bVar2 = local_1a0.table[(long)pBVar28].nbAdditionalBits;
              local_140 = (BYTE *)(ulong)local_1b0.table[(long)pBVar23].nextState;
              local_130 = (ulong)local_190.table[sVar8].nextState;
              local_1e8 = (BYTE *)(ulong)local_1a0.table[(long)pBVar28].nextState;
              bVar12 = local_1b0.table[(long)pBVar23].nbBits;
              local_124 = (uint)bVar12;
              bVar3 = local_190.table[sVar8].nbBits;
              local_1e0 = (BYTE *)CONCAT44(local_1e0._4_4_,(uint)bVar3);
              bVar4 = local_1a0.table[(long)pBVar28].nbBits;
              local_138 = (BYTE *)CONCAT44(local_138._4_4_,(uint)bVar4);
              bVar10 = (byte)uVar7;
              if (bVar2 < 2) {
                if (bVar2 == 0) {
                  local_180[0] = local_180[uVar27 == 0];
                  local_180[1] = local_180[uVar27 != 0];
                }
                else {
                  uVar7 = uVar7 + 1;
                  lVar15 = (ulong)(local_1a0.table[(long)pBVar28].baseValue + (uint)(uVar27 == 0)) -
                           ((long)(local_248 << (bVar10 & 0x3f)) >> 0x3f);
                  local_1d8.bitsConsumed = uVar7;
                  if (lVar15 == 3) {
                    local_180[0] = (BYTE *)(-(ulong)(local_180[1] + -1 == (BYTE *)0x0) |
                                           (ulong)(local_180[1] + -1));
                  }
                  else {
                    local_180[0] = (BYTE *)(-(ulong)(local_180[lVar15] == (BYTE *)0x0) |
                                           (ulong)local_180[lVar15]);
                    if (lVar15 == 1) goto LAB_01d5df9e;
                  }
                  local_180[2] = local_208;
                }
              }
              else {
                uVar7 = uVar7 + bVar2;
                local_180[2] = local_208;
                local_180[0] = (BYTE *)(((local_248 << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f)) +
                                       (ulong)local_1a0.table[(long)pBVar28].baseValue);
                local_1d8.bitsConsumed = uVar7;
              }
LAB_01d5df9e:
              if (bVar11 != 0) {
                bVar10 = (byte)uVar7;
                uVar7 = uVar7 + bVar11;
                local_1f0 = local_1f0 + ((local_248 << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
                local_1d8.bitsConsumed = uVar7;
              }
              local_148._0_4_ = (int)local_1d8.start;
              if (0x1e < (byte)(bVar11 + bVar1 + bVar2)) {
                if (uVar7 < 0x41) {
                  if (local_240 < local_1d8.limitPtr) {
                    if (local_240 == (ulong *)local_1d8.start) goto LAB_01d5dff4;
                    uVar27 = (int)local_240 - (int)local_148;
                    if (local_1d8.start <= (ulong *)((long)local_240 - (ulong)(uVar7 >> 3))) {
                      uVar27 = uVar7 >> 3;
                    }
                    uVar7 = uVar7 + uVar27 * -8;
                  }
                  else {
                    uVar27 = uVar7 >> 3;
                    uVar7 = uVar7 & 7;
                  }
                  local_240 = (ulong *)((long)local_240 - (ulong)uVar27);
                  local_248 = *local_240;
                  local_1d8.bitContainer = local_248;
                  local_1d8.bitsConsumed = uVar7;
                  local_1d8.ptr = (char *)local_240;
                }
                else {
                  local_240 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
                  local_1d8.ptr = "";
                }
              }
LAB_01d5dff4:
              if (bVar1 != 0) {
                bVar11 = (byte)uVar7;
                uVar7 = uVar7 + bVar1;
                uVar18 = uVar18 + ((local_248 << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
                local_1d8.bitsConsumed = uVar7;
              }
              if (local_118 != lVar9) {
                iVar20 = uVar7 + bVar12;
                pBVar23 = (BYTE *)(ulong)local_1b0.table[(long)pBVar23].nextState +
                          (~(-1L << (bVar12 & 0x3f)) & local_248 >> (-(char)iVar20 & 0x3fU));
                iVar20 = iVar20 + (uint)bVar3;
                uVar7 = iVar20 + (uint)bVar4;
                sVar8 = (~(-1L << (bVar3 & 0x3f)) & local_248 >> (-(char)iVar20 & 0x3fU)) +
                        (ulong)local_190.table[sVar8].nextState;
                pBVar28 = local_1e8 +
                          (~(-1L << (bVar4 & 0x3f)) & local_248 >> (-(char)uVar7 & 0x3fU));
                local_1d8.bitsConsumed = uVar7;
                local_1b0.state = (size_t)pBVar23;
                local_1a0.state = (size_t)pBVar28;
                local_190.state = sVar8;
                if (uVar7 < 0x41) {
                  if (local_240 < local_1d8.limitPtr) {
                    if (local_240 == (ulong *)local_1d8.start) goto LAB_01d5e162;
                    uVar27 = (int)local_240 - (int)local_148;
                    if (local_1d8.start <= (ulong *)((long)local_240 - (ulong)(uVar7 >> 3))) {
                      uVar27 = uVar7 >> 3;
                    }
                    uVar7 = uVar7 + uVar27 * -8;
                  }
                  else {
                    uVar27 = uVar7 >> 3;
                    uVar7 = uVar7 & 7;
                  }
                  local_240 = (ulong *)((long)local_240 - (ulong)uVar27);
                  local_248 = *local_240;
                  local_1d8.bitContainer = local_248;
                  local_1d8.bitsConsumed = uVar7;
                  local_1d8.ptr = (char *)local_240;
                }
                else {
                  local_1d8.ptr = "";
                  local_240 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
                }
              }
LAB_01d5e162:
              *(ulong *)((long)auStack_f8 + lVar9) = uVar18;
              *(BYTE **)((long)auStack_f8 + lVar9 + 8) = local_1f0;
              *(BYTE **)((long)auStack_f8 + lVar9 + 0x10) = local_180[0];
              lVar9 = lVar9 + 0x18;
              uVar27 = local_14c;
              local_208 = local_180[1];
              local_148 = puVar29;
            } while ((ulong)local_14c * 0x18 != lVar9);
          }
          local_218 = (ulong)(uint)nbSeq;
          if ((int)uVar27 < nbSeq) {
            local_130 = CONCAT44(local_130._4_4_,nbSeq + -1);
            local_138 = oend_00 + -0x20;
            local_1e8 = dctx->litExtraBuffer;
            local_140 = dctx->litExtraBuffer + 0x10000;
            uVar7 = uVar27;
            do {
              pBVar23 = local_1e8;
              local_208 = (BYTE *)(ulong)local_190.table[local_190.state].baseValue;
              uVar27 = local_1b0.table[local_1b0.state].baseValue;
              local_1f0 = (BYTE *)(ulong)uVar27;
              bVar1 = local_1b0.table[local_1b0.state].nbAdditionalBits;
              bVar11 = local_190.table[local_190.state].nbAdditionalBits;
              bVar2 = local_1a0.table[local_1a0.state].nbAdditionalBits;
              bVar12 = (byte)local_1d8.bitsConsumed;
              if (bVar2 < 2) {
                if (bVar2 == 0) {
                  pBVar28 = local_180[uVar27 == 0];
                  ppBVar13 = local_180 + (uVar27 != 0);
                }
                else {
                  local_1d8.bitsConsumed = local_1d8.bitsConsumed + 1;
                  lVar9 = (ulong)(local_1a0.table[local_1a0.state].baseValue + (uint)(uVar27 == 0))
                          - ((long)(local_1d8.bitContainer << (bVar12 & 0x3f)) >> 0x3f);
                  if (lVar9 == 3) {
                    pBVar28 = (BYTE *)(-(ulong)(local_180[0] + -1 == (BYTE *)0x0) |
                                      (ulong)(local_180[0] + -1));
                  }
                  else {
                    pBVar28 = (BYTE *)(-(ulong)(local_180[lVar9] == (BYTE *)0x0) |
                                      (ulong)local_180[lVar9]);
                    ppBVar13 = local_180;
                    if (lVar9 == 1) goto LAB_01d5e47f;
                  }
                  local_180[2] = local_180[1];
                  ppBVar13 = local_180;
                }
              }
              else {
                local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar2;
                pBVar28 = (BYTE *)(((local_1d8.bitContainer << (bVar12 & 0x3f)) >> (-bVar2 & 0x3f))
                                  + (ulong)local_1a0.table[local_1a0.state].baseValue);
                local_180[2] = local_180[1];
                ppBVar13 = local_180;
              }
LAB_01d5e47f:
              local_180[1] = *ppBVar13;
              local_180[0] = pBVar28;
              if (bVar11 != 0) {
                bVar12 = (byte)local_1d8.bitsConsumed;
                local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar11;
                local_208 = local_208 +
                            ((local_1d8.bitContainer << (bVar12 & 0x3f)) >> (-bVar11 & 0x3f));
              }
              if (0x1e < (byte)(bVar11 + bVar1 + bVar2)) {
                if (local_1d8.bitsConsumed < 0x41) {
                  if (local_1d8.ptr < local_1d8.limitPtr) {
                    if (local_1d8.ptr == local_1d8.start) goto LAB_01d5e4d7;
                    uVar18 = (ulong)(uint)((int)local_1d8.ptr - (int)local_1d8.start);
                    if (local_1d8.start <=
                        (ulong *)((long)local_1d8.ptr - (ulong)(local_1d8.bitsConsumed >> 3))) {
                      uVar18 = (ulong)(local_1d8.bitsConsumed >> 3);
                    }
                    local_1d8.bitsConsumed = local_1d8.bitsConsumed + (int)uVar18 * -8;
                  }
                  else {
                    uVar18 = (ulong)(local_1d8.bitsConsumed >> 3);
                    local_1d8.bitsConsumed = local_1d8.bitsConsumed & 7;
                  }
                  local_1d8.ptr = (char *)((long)local_1d8.ptr - uVar18);
                  local_1d8.bitContainer = *(BitContainerType *)local_1d8.ptr;
                }
                else {
                  local_1d8.ptr = "";
                }
              }
LAB_01d5e4d7:
              if (bVar1 != 0) {
                bVar11 = (byte)local_1d8.bitsConsumed;
                local_1d8.bitsConsumed = local_1d8.bitsConsumed + bVar1;
                local_1f0 = local_1f0 +
                            ((local_1d8.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
              }
              if (uVar7 != (uint)local_130) {
                iVar20 = local_1b0.table[local_1b0.state].nbBits + local_1d8.bitsConsumed;
                iVar21 = iVar20 + (uint)local_190.table[local_190.state].nbBits;
                local_1b0.state =
                     (~(-1L << (local_1b0.table[local_1b0.state].nbBits & 0x3f)) &
                     local_1d8.bitContainer >> (-(char)iVar20 & 0x3fU)) +
                     (ulong)local_1b0.table[local_1b0.state].nextState;
                local_1d8.bitsConsumed = iVar21 + (uint)local_1a0.table[local_1a0.state].nbBits;
                local_190.state =
                     (~(-1L << (local_190.table[local_190.state].nbBits & 0x3f)) &
                     local_1d8.bitContainer >> (-(char)iVar21 & 0x3fU)) +
                     (ulong)local_190.table[local_190.state].nextState;
                local_1a0.state =
                     (~(-1L << (local_1a0.table[local_1a0.state].nbBits & 0x3f)) &
                     local_1d8.bitContainer >> (-(char)local_1d8.bitsConsumed & 0x3fU)) +
                     (ulong)local_1a0.table[local_1a0.state].nextState;
                if (local_1d8.bitsConsumed < 0x41) {
                  if (local_1d8.ptr < local_1d8.limitPtr) {
                    if (local_1d8.ptr == local_1d8.start) goto LAB_01d5e61f;
                    uVar27 = (int)local_1d8.ptr - (int)local_1d8.start;
                    if (local_1d8.start <=
                        (ulong *)((long)local_1d8.ptr - (ulong)(local_1d8.bitsConsumed >> 3))) {
                      uVar27 = local_1d8.bitsConsumed >> 3;
                    }
                    local_1d8.bitsConsumed = local_1d8.bitsConsumed + uVar27 * -8;
                  }
                  else {
                    uVar27 = local_1d8.bitsConsumed >> 3;
                    local_1d8.bitsConsumed = local_1d8.bitsConsumed & 7;
                  }
                  local_1d8.ptr = (char *)((long)local_1d8.ptr - (ulong)uVar27);
                  local_1d8.bitContainer = *(BitContainerType *)local_1d8.ptr;
                }
                else {
                  local_1d8.ptr = "";
                }
              }
LAB_01d5e61f:
              if (dctx->litBufferLocation == ZSTD_split) {
                uVar16 = (ulong)(uVar7 & 7);
                puVar29 = auStack_f8 + uVar16 * 3;
                uVar18 = *puVar29;
                pBVar24 = local_220 + uVar18;
                if (pBVar24 <= dctx->litBufferEnd) {
                  sVar17 = auStack_f8[uVar16 * 3 + 1];
                  pBVar23 = (BYTE *)auStack_f8[uVar16 * 3 + 2];
                  if ((local_1f8 < pBVar24) ||
                     (pBVar26 = (BYTE *)(uVar18 + sVar17), pBVar24 + -0x20 < pBVar22 + (long)pBVar26
                     )) {
                    sequence_00.matchLength = sVar17;
                    sequence_00.litLength = uVar18;
                    sequence_00.offset = (size_t)pBVar23;
                    local_168 = uVar18;
                    sStack_160 = sVar17;
                    local_158 = pBVar23;
                    pBVar26 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                                (pBVar22,oend_00,pBVar24 + -0x20,sequence_00,
                                                 &local_220,local_1f8,pBVar19,local_200,local_210);
                  }
                  else {
                    pBVar14 = pBVar22 + uVar18;
                    uVar5 = *(undefined8 *)(local_220 + 8);
                    *(undefined8 *)pBVar22 = *(undefined8 *)local_220;
                    *(undefined8 *)(pBVar22 + 8) = uVar5;
                    if (0x10 < uVar18) {
                      uVar5 = *(undefined8 *)(local_220 + 0x18);
                      *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_220 + 0x10);
                      *(undefined8 *)(pBVar22 + 0x18) = uVar5;
                      if (0x10 < (long)(uVar18 - 0x10)) {
                        lVar9 = 0;
                        do {
                          uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x20 + 8);
                          pBVar30 = pBVar22 + lVar9 + 0x20;
                          *(undefined8 *)pBVar30 = *(undefined8 *)(local_220 + lVar9 + 0x20);
                          *(undefined8 *)(pBVar30 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x30 + 8);
                          *(undefined8 *)(pBVar30 + 0x10) =
                               *(undefined8 *)(local_220 + lVar9 + 0x30);
                          *(undefined8 *)(pBVar30 + 0x18) = uVar5;
                          lVar9 = lVar9 + 0x20;
                        } while (pBVar30 + 0x20 < pBVar14);
                      }
                    }
                    pBVar30 = pBVar14 + -(long)pBVar23;
                    local_220 = pBVar24;
                    if (pBVar14 + -(long)pBVar19 < pBVar23) {
                      local_1e0 = pBVar26;
                      if (pBVar14 + -(long)local_200 < pBVar23) {
                        pBVar26 = (BYTE *)0xffffffffffffffec;
                      }
                      else {
                        lVar9 = (long)pBVar30 - (long)pBVar19;
                        pBVar24 = local_210 + lVar9;
                        if (local_210 < pBVar24 + sVar17) {
                          memmove(pBVar14,pBVar24,-lVar9);
                          pBVar14 = pBVar14 + -lVar9;
                          sVar17 = sVar17 + lVar9;
                          pBVar26 = local_1e0;
                          pBVar30 = pBVar19;
                          goto LAB_01d5e9aa;
                        }
                        memmove(pBVar14,pBVar24,sVar17);
                        pBVar26 = local_1e0;
                      }
                    }
                    else {
LAB_01d5e9aa:
                      if (pBVar23 < (BYTE *)0x10) {
                        if (pBVar23 < (BYTE *)0x8) {
                          iVar20 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec64table + (long)pBVar23 * 4);
                          *pBVar14 = *pBVar30;
                          pBVar14[1] = pBVar30[1];
                          pBVar14[2] = pBVar30[2];
                          pBVar14[3] = pBVar30[3];
                          pBVar24 = pBVar30 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar23 * 4);
                          pBVar30 = pBVar30 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar23 * 4) - (long)iVar20);
                          *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar24;
                        }
                        else {
                          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                        }
                        if (8 < sVar17) {
                          pBVar23 = pBVar30 + 8;
                          pBVar24 = pBVar14 + 8;
                          if ((long)pBVar24 - (long)pBVar23 < 0x10) {
                            do {
                              *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
                              pBVar24 = pBVar24 + 8;
                              pBVar23 = pBVar23 + 8;
                            } while (pBVar24 < pBVar14 + sVar17);
                          }
                          else {
                            uVar5 = *(undefined8 *)(pBVar30 + 0x10);
                            *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
                            *(undefined8 *)(pBVar14 + 0x10) = uVar5;
                            if (0x18 < (long)sVar17) {
                              lVar9 = 0;
                              do {
                                uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x18 + 8);
                                pBVar23 = pBVar14 + lVar9 + 0x18;
                                *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar30 + lVar9 + 0x18);
                                *(undefined8 *)(pBVar23 + 8) = uVar5;
                                uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x28 + 8);
                                *(undefined8 *)(pBVar23 + 0x10) =
                                     *(undefined8 *)(pBVar30 + lVar9 + 0x28);
                                *(undefined8 *)(pBVar23 + 0x18) = uVar5;
                                lVar9 = lVar9 + 0x20;
                              } while (pBVar23 + 0x20 < pBVar14 + sVar17);
                            }
                          }
                        }
                      }
                      else {
                        uVar5 = *(undefined8 *)(pBVar30 + 8);
                        *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                        *(undefined8 *)(pBVar14 + 8) = uVar5;
                        if (0x10 < (long)sVar17) {
                          lVar9 = 0x10;
                          do {
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 8);
                            pBVar23 = pBVar14 + lVar9;
                            *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar30 + lVar9);
                            *(undefined8 *)(pBVar23 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x10 + 8);
                            *(undefined8 *)(pBVar23 + 0x10) =
                                 *(undefined8 *)(pBVar30 + lVar9 + 0x10);
                            *(undefined8 *)(pBVar23 + 0x18) = uVar5;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar23 + 0x20 < pBVar14 + sVar17);
                        }
                      }
                    }
                  }
                  uVar27 = (uint)local_218;
                  goto LAB_01d5eab0;
                }
                uVar25 = (long)dctx->litBufferEnd - (long)local_220;
                if (uVar25 != 0) {
                  if ((ulong)((long)oend_00 - (long)pBVar22) < uVar25) {
                    return 0xffffffffffffffba;
                  }
                  ZSTD_safecopyDstBeforeSrc(pBVar22,local_220,uVar25);
                  uVar18 = uVar18 - uVar25;
                  *puVar29 = uVar18;
                  pBVar22 = pBVar22 + uVar25;
                }
                local_220 = pBVar23;
                dctx->litBufferLocation = ZSTD_not_in_dst;
                sVar17 = auStack_f8[uVar16 * 3 + 1];
                pBVar24 = (BYTE *)auStack_f8[uVar16 * 3 + 2];
                if (((long)uVar18 < 0x10001) &&
                   (uVar25 = uVar18 + sVar17, pBVar22 + uVar25 <= local_138)) {
                  pBVar26 = pBVar22 + uVar18;
                  uVar5 = *(undefined8 *)(pBVar23 + 8);
                  *(undefined8 *)pBVar22 = *(undefined8 *)pBVar23;
                  *(undefined8 *)(pBVar22 + 8) = uVar5;
                  if (0x10 < uVar18) {
                    uVar5 = *(undefined8 *)(dctx->litExtraBuffer + 0x18);
                    *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + 0x10);
                    *(undefined8 *)(pBVar22 + 0x18) = uVar5;
                    if (0x10 < (long)(uVar18 - 0x10)) {
                      lVar9 = 0;
                      do {
                        uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20 + 8);
                        pBVar14 = pBVar22 + lVar9 + 0x20;
                        *(undefined8 *)pBVar14 =
                             *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20);
                        *(undefined8 *)(pBVar14 + 8) = uVar5;
                        uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30 + 8);
                        *(undefined8 *)(pBVar14 + 0x10) =
                             *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30);
                        *(undefined8 *)(pBVar14 + 0x18) = uVar5;
                        lVar9 = lVar9 + 0x20;
                      } while (pBVar14 + 0x20 < pBVar26);
                    }
                  }
                  local_220 = pBVar23 + uVar18;
                  pBVar23 = pBVar26 + -(long)pBVar24;
                  if (pBVar26 + -(long)pBVar19 < pBVar24) {
                    if (pBVar26 + -(long)local_200 < pBVar24) goto LAB_01d5fc64;
                    lVar9 = (long)pBVar23 - (long)pBVar19;
                    pBVar23 = local_210 + lVar9;
                    if (pBVar23 + sVar17 <= local_210) {
                      memmove(pBVar26,pBVar23,sVar17);
                      goto LAB_01d5eb2e;
                    }
                    local_1e0 = pBVar24;
                    memmove(pBVar26,pBVar23,-lVar9);
                    pBVar26 = pBVar26 + -lVar9;
                    sVar17 = sVar17 + lVar9;
                    pBVar24 = local_1e0;
                    pBVar23 = pBVar19;
                  }
                  if (pBVar24 < (BYTE *)0x10) {
                    if (pBVar24 < (BYTE *)0x8) {
                      iVar20 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                        ::dec64table + (long)pBVar24 * 4);
                      *pBVar26 = *pBVar23;
                      pBVar26[1] = pBVar23[1];
                      pBVar26[2] = pBVar23[2];
                      pBVar26[3] = pBVar23[3];
                      pBVar14 = pBVar23 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4);
                      pBVar23 = pBVar23 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4) - (long)iVar20);
                      *(undefined4 *)(pBVar26 + 4) = *(undefined4 *)pBVar14;
                    }
                    else {
                      *(undefined8 *)pBVar26 = *(undefined8 *)pBVar23;
                    }
                    if (8 < sVar17) {
                      pBVar24 = pBVar23 + 8;
                      pBVar14 = pBVar26 + 8;
                      if ((long)pBVar14 - (long)pBVar24 < 0x10) {
                        do {
                          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar24;
                          pBVar14 = pBVar14 + 8;
                          pBVar24 = pBVar24 + 8;
                        } while (pBVar14 < pBVar26 + sVar17);
                      }
                      else {
                        uVar5 = *(undefined8 *)(pBVar23 + 0x10);
                        *(undefined8 *)pBVar14 = *(undefined8 *)pBVar24;
                        *(undefined8 *)(pBVar26 + 0x10) = uVar5;
                        if (0x18 < (long)sVar17) {
                          lVar9 = 0;
                          do {
                            uVar5 = *(undefined8 *)(pBVar23 + lVar9 + 0x18 + 8);
                            pBVar24 = pBVar26 + lVar9 + 0x18;
                            *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar23 + lVar9 + 0x18);
                            *(undefined8 *)(pBVar24 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(pBVar23 + lVar9 + 0x28 + 8);
                            *(undefined8 *)(pBVar24 + 0x10) =
                                 *(undefined8 *)(pBVar23 + lVar9 + 0x28);
                            *(undefined8 *)(pBVar24 + 0x18) = uVar5;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar24 + 0x20 < pBVar26 + sVar17);
                        }
                      }
                    }
                  }
                  else {
                    uVar5 = *(undefined8 *)(pBVar23 + 8);
                    *(undefined8 *)pBVar26 = *(undefined8 *)pBVar23;
                    *(undefined8 *)(pBVar26 + 8) = uVar5;
                    if (0x10 < (long)sVar17) {
                      lVar9 = 0x10;
                      do {
                        uVar5 = *(undefined8 *)(pBVar23 + lVar9 + 8);
                        pBVar24 = pBVar26 + lVar9;
                        *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar23 + lVar9);
                        *(undefined8 *)(pBVar24 + 8) = uVar5;
                        uVar5 = *(undefined8 *)(pBVar23 + lVar9 + 0x10 + 8);
                        *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar23 + lVar9 + 0x10);
                        *(undefined8 *)(pBVar24 + 0x18) = uVar5;
                        lVar9 = lVar9 + 0x20;
                      } while (pBVar24 + 0x20 < pBVar26 + sVar17);
                    }
                  }
                }
                else {
                  sequence_01.matchLength = sVar17;
                  sequence_01.litLength = uVar18;
                  sequence_01.offset = (size_t)pBVar24;
                  local_168 = uVar18;
                  sStack_160 = sVar17;
                  local_158 = pBVar24;
                  uVar25 = ZSTD_execSequenceEnd
                                     (pBVar22,oend_00,sequence_01,&local_220,local_140,pBVar19,
                                      local_200,local_210);
                }
LAB_01d5eb2e:
                uVar27 = (uint)local_218;
                if (0xffffffffffffff88 < uVar25) {
                  return uVar25;
                }
                *puVar29 = (ulong)local_1f0;
                auStack_f8[uVar16 * 3 + 1] = (ulong)local_208;
                auStack_f8[uVar16 * 3 + 2] = (ulong)pBVar28;
                pBVar22 = pBVar22 + uVar25;
                local_1f8 = local_140;
              }
              else {
                uVar16 = (ulong)(uVar7 & 7);
                uVar18 = auStack_f8[uVar16 * 3];
                sVar17 = auStack_f8[uVar16 * 3 + 1];
                pBVar24 = (BYTE *)auStack_f8[uVar16 * 3 + 2];
                pBVar23 = local_220 + uVar18;
                if ((local_1f8 < pBVar23) ||
                   (pBVar26 = (BYTE *)(uVar18 + sVar17), local_138 < pBVar22 + (long)pBVar26)) {
                  sequence.matchLength = sVar17;
                  sequence.litLength = uVar18;
                  sequence.offset = (size_t)pBVar24;
                  local_168 = uVar18;
                  sStack_160 = sVar17;
                  local_158 = pBVar24;
                  pBVar26 = (BYTE *)ZSTD_execSequenceEnd
                                              (pBVar22,oend_00,sequence,&local_220,local_1f8,pBVar19
                                               ,local_200,local_210);
                  uVar27 = (uint)local_218;
                  goto LAB_01d5eab0;
                }
                pBVar14 = pBVar22 + uVar18;
                uVar5 = *(undefined8 *)(local_220 + 8);
                *(undefined8 *)pBVar22 = *(undefined8 *)local_220;
                *(undefined8 *)(pBVar22 + 8) = uVar5;
                if (0x10 < uVar18) {
                  uVar5 = *(undefined8 *)(local_220 + 0x18);
                  *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_220 + 0x10);
                  *(undefined8 *)(pBVar22 + 0x18) = uVar5;
                  if (0x10 < (long)(uVar18 - 0x10)) {
                    lVar9 = 0;
                    do {
                      uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x20 + 8);
                      pBVar30 = pBVar22 + lVar9 + 0x20;
                      *(undefined8 *)pBVar30 = *(undefined8 *)(local_220 + lVar9 + 0x20);
                      *(undefined8 *)(pBVar30 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x30 + 8);
                      *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(local_220 + lVar9 + 0x30);
                      *(undefined8 *)(pBVar30 + 0x18) = uVar5;
                      lVar9 = lVar9 + 0x20;
                    } while (pBVar30 + 0x20 < pBVar14);
                  }
                }
                pBVar30 = pBVar14 + -(long)pBVar24;
                local_220 = pBVar23;
                if (pBVar14 + -(long)pBVar19 < pBVar24) {
                  local_1e0 = pBVar26;
                  if (pBVar24 <= pBVar14 + -(long)local_200) {
                    lVar9 = (long)(pBVar14 + -(long)pBVar24) - (long)pBVar19;
                    pBVar23 = local_210 + lVar9;
                    if (pBVar23 + sVar17 <= local_210) {
                      memmove(pBVar14,pBVar23,sVar17);
                      uVar27 = (uint)local_218;
                      pBVar26 = local_1e0;
                      goto LAB_01d5eab0;
                    }
                    memmove(pBVar14,pBVar23,-lVar9);
                    pBVar14 = pBVar14 + -lVar9;
                    sVar17 = sVar17 + lVar9;
                    pBVar26 = local_1e0;
                    pBVar30 = pBVar19;
                    goto LAB_01d5e870;
                  }
                  pBVar26 = (BYTE *)0xffffffffffffffec;
LAB_01d5e88d:
                  uVar27 = (uint)local_218;
                }
                else {
LAB_01d5e870:
                  uVar27 = (uint)local_218;
                  if (pBVar24 < (BYTE *)0x10) {
                    if (pBVar24 < (BYTE *)0x8) {
                      iVar20 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                        ::dec64table + (long)pBVar24 * 4);
                      *pBVar14 = *pBVar30;
                      pBVar14[1] = pBVar30[1];
                      pBVar14[2] = pBVar30[2];
                      pBVar14[3] = pBVar30[3];
                      pBVar23 = pBVar30 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4);
                      pBVar30 = pBVar30 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4) - (long)iVar20);
                      *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar23;
                    }
                    else {
                      *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                    }
                    if (8 < sVar17) {
                      pBVar23 = pBVar30 + 8;
                      pBVar24 = pBVar14 + 8;
                      if ((long)pBVar24 - (long)pBVar23 < 0x10) {
                        do {
                          *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
                          pBVar24 = pBVar24 + 8;
                          pBVar23 = pBVar23 + 8;
                        } while (pBVar24 < pBVar14 + sVar17);
                      }
                      else {
                        uVar5 = *(undefined8 *)(pBVar30 + 0x10);
                        *(undefined8 *)pBVar24 = *(undefined8 *)pBVar23;
                        *(undefined8 *)(pBVar14 + 0x10) = uVar5;
                        if (0x18 < (long)sVar17) {
                          lVar9 = 0;
                          do {
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x18 + 8);
                            pBVar23 = pBVar14 + lVar9 + 0x18;
                            *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar30 + lVar9 + 0x18);
                            *(undefined8 *)(pBVar23 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x28 + 8);
                            *(undefined8 *)(pBVar23 + 0x10) =
                                 *(undefined8 *)(pBVar30 + lVar9 + 0x28);
                            *(undefined8 *)(pBVar23 + 0x18) = uVar5;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar23 + 0x20 < pBVar14 + sVar17);
                        }
                      }
                    }
                  }
                  else {
                    uVar5 = *(undefined8 *)(pBVar30 + 8);
                    *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                    *(undefined8 *)(pBVar14 + 8) = uVar5;
                    if ((long)sVar17 < 0x11) goto LAB_01d5e88d;
                    lVar9 = 0x10;
                    do {
                      uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 8);
                      pBVar23 = pBVar14 + lVar9;
                      *(undefined8 *)pBVar23 = *(undefined8 *)(pBVar30 + lVar9);
                      *(undefined8 *)(pBVar23 + 8) = uVar5;
                      uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x10 + 8);
                      *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar30 + lVar9 + 0x10);
                      *(undefined8 *)(pBVar23 + 0x18) = uVar5;
                      lVar9 = lVar9 + 0x20;
                    } while (pBVar23 + 0x20 < pBVar14 + sVar17);
                  }
                }
LAB_01d5eab0:
                if ((BYTE *)0xffffffffffffff88 < pBVar26) {
                  return (size_t)pBVar26;
                }
                uVar18 = (ulong)(uVar7 & 7);
                auStack_f8[uVar18 * 3] = (ulong)local_1f0;
                auStack_f8[uVar18 * 3 + 1] = (ulong)local_208;
                auStack_f8[uVar18 * 3 + 2] = (ulong)pBVar28;
                pBVar22 = pBVar22 + (long)pBVar26;
              }
              uVar7 = uVar7 + 1;
              nbSeq = uVar27;
            } while (uVar7 != uVar27);
          }
          if ((local_1d8.ptr == local_1d8.start) && (local_1d8.bitsConsumed == 0x40)) {
            uVar27 = uVar27 - local_14c;
            if ((int)uVar27 < nbSeq) {
              local_1f0 = oend_00 + -0x20;
              pBVar23 = dctx->litExtraBuffer;
              local_1e8 = dctx->litExtraBuffer + 0x10000;
              do {
                uVar18 = (ulong)(uVar27 & 7);
                puVar29 = auStack_f8 + uVar18 * 3;
                if (dctx->litBufferLocation == ZSTD_split) {
                  uVar16 = *puVar29;
                  pBVar28 = local_220 + uVar16;
                  if (pBVar28 <= dctx->litBufferEnd) {
                    sVar17 = auStack_f8[uVar18 * 3 + 1];
                    pBVar24 = (BYTE *)auStack_f8[uVar18 * 3 + 2];
                    if ((local_1f8 < pBVar28) ||
                       (pBVar26 = (BYTE *)(uVar16 + sVar17),
                       pBVar28 + -0x20 < pBVar22 + (long)pBVar26)) {
                      sequence_03.matchLength = sVar17;
                      sequence_03.litLength = uVar16;
                      sequence_03.offset = (size_t)pBVar24;
                      local_168 = uVar16;
                      sStack_160 = sVar17;
                      local_158 = pBVar24;
                      pBVar26 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                                  (pBVar22,oend_00,pBVar28 + -0x20,sequence_03,
                                                   &local_220,local_1f8,pBVar19,local_200,local_210)
                      ;
                    }
                    else {
                      pBVar14 = pBVar22 + uVar16;
                      uVar5 = *(undefined8 *)(local_220 + 8);
                      *(undefined8 *)pBVar22 = *(undefined8 *)local_220;
                      *(undefined8 *)(pBVar22 + 8) = uVar5;
                      if (0x10 < uVar16) {
                        uVar5 = *(undefined8 *)(local_220 + 0x18);
                        *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_220 + 0x10);
                        *(undefined8 *)(pBVar22 + 0x18) = uVar5;
                        if (0x10 < (long)(uVar16 - 0x10)) {
                          lVar9 = 0;
                          do {
                            uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x20 + 8);
                            pBVar30 = pBVar22 + lVar9 + 0x20;
                            *(undefined8 *)pBVar30 = *(undefined8 *)(local_220 + lVar9 + 0x20);
                            *(undefined8 *)(pBVar30 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x30 + 8);
                            *(undefined8 *)(pBVar30 + 0x10) =
                                 *(undefined8 *)(local_220 + lVar9 + 0x30);
                            *(undefined8 *)(pBVar30 + 0x18) = uVar5;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar30 + 0x20 < pBVar14);
                        }
                      }
                      pBVar30 = pBVar14 + -(long)pBVar24;
                      local_220 = pBVar28;
                      if (pBVar14 + -(long)pBVar19 < pBVar24) {
                        local_208 = pBVar26;
                        if (pBVar14 + -(long)local_200 < pBVar24) goto LAB_01d5f91e;
                        lVar9 = (long)(pBVar14 + -(long)pBVar24) - (long)pBVar19;
                        pBVar28 = local_210 + lVar9;
                        if (pBVar28 + sVar17 <= local_210) {
                          memmove(pBVar14,pBVar28,sVar17);
                          pBVar26 = local_208;
                          goto LAB_01d5f719;
                        }
                        memmove(pBVar14,pBVar28,-lVar9);
                        pBVar14 = pBVar14 + -lVar9;
                        sVar17 = sVar17 + lVar9;
                        pBVar26 = local_208;
                        pBVar30 = pBVar19;
                      }
                      if (pBVar24 < (BYTE *)0x10) {
                        if (pBVar24 < (BYTE *)0x8) {
                          iVar20 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec64table + (long)pBVar24 * 4);
                          *pBVar14 = *pBVar30;
                          pBVar14[1] = pBVar30[1];
                          pBVar14[2] = pBVar30[2];
                          pBVar14[3] = pBVar30[3];
                          pBVar28 = pBVar30 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4);
                          pBVar30 = pBVar30 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4) - (long)iVar20);
                          *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar28;
                        }
                        else {
                          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                        }
                        if (8 < sVar17) {
                          pBVar28 = pBVar30 + 8;
                          pBVar24 = pBVar14 + 8;
                          if ((long)pBVar24 - (long)pBVar28 < 0x10) {
                            do {
                              *(undefined8 *)pBVar24 = *(undefined8 *)pBVar28;
                              pBVar24 = pBVar24 + 8;
                              pBVar28 = pBVar28 + 8;
                            } while (pBVar24 < pBVar14 + sVar17);
                          }
                          else {
                            uVar5 = *(undefined8 *)(pBVar30 + 0x10);
                            *(undefined8 *)pBVar24 = *(undefined8 *)pBVar28;
                            *(undefined8 *)(pBVar14 + 0x10) = uVar5;
                            if (0x18 < (long)sVar17) {
                              lVar9 = 0;
                              do {
                                uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x18 + 8);
                                pBVar28 = pBVar14 + lVar9 + 0x18;
                                *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar30 + lVar9 + 0x18);
                                *(undefined8 *)(pBVar28 + 8) = uVar5;
                                uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x28 + 8);
                                *(undefined8 *)(pBVar28 + 0x10) =
                                     *(undefined8 *)(pBVar30 + lVar9 + 0x28);
                                *(undefined8 *)(pBVar28 + 0x18) = uVar5;
                                lVar9 = lVar9 + 0x20;
                              } while (pBVar28 + 0x20 < pBVar14 + sVar17);
                            }
                          }
                        }
                      }
                      else {
                        uVar5 = *(undefined8 *)(pBVar30 + 8);
                        *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                        *(undefined8 *)(pBVar14 + 8) = uVar5;
                        if (0x10 < (long)sVar17) {
                          lVar9 = 0x10;
                          do {
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 8);
                            pBVar28 = pBVar14 + lVar9;
                            *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar30 + lVar9);
                            *(undefined8 *)(pBVar28 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x10 + 8);
                            *(undefined8 *)(pBVar28 + 0x10) =
                                 *(undefined8 *)(pBVar30 + lVar9 + 0x10);
                            *(undefined8 *)(pBVar28 + 0x18) = uVar5;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar28 + 0x20 < pBVar14 + sVar17);
                        }
                      }
                    }
                    goto LAB_01d5f719;
                  }
                  uVar25 = (long)dctx->litBufferEnd - (long)local_220;
                  if (uVar25 != 0) {
                    if ((ulong)((long)oend_00 - (long)pBVar22) < uVar25) {
                      return 0xffffffffffffffba;
                    }
                    ZSTD_safecopyDstBeforeSrc(pBVar22,local_220,uVar25);
                    uVar16 = uVar16 - uVar25;
                    *puVar29 = uVar16;
                    pBVar22 = pBVar22 + uVar25;
                  }
                  dctx->litBufferLocation = ZSTD_not_in_dst;
                  sVar17 = auStack_f8[uVar18 * 3 + 1];
                  pBVar28 = (BYTE *)auStack_f8[uVar18 * 3 + 2];
                  if (((long)uVar16 < 0x10001) &&
                     (uVar18 = uVar16 + sVar17, pBVar22 + uVar18 <= local_1f0)) {
                    pBVar24 = pBVar22 + uVar16;
                    uVar5 = *(undefined8 *)(dctx->litExtraBuffer + 8);
                    *(undefined8 *)pBVar22 = *(undefined8 *)pBVar23;
                    *(undefined8 *)(pBVar22 + 8) = uVar5;
                    if (0x10 < uVar16) {
                      uVar5 = *(undefined8 *)(dctx->litExtraBuffer + 0x18);
                      *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + 0x10)
                      ;
                      *(undefined8 *)(pBVar22 + 0x18) = uVar5;
                      if (0x10 < (long)(uVar16 - 0x10)) {
                        lVar9 = 0;
                        do {
                          uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20 + 8);
                          pBVar26 = pBVar22 + lVar9 + 0x20;
                          *(undefined8 *)pBVar26 =
                               *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x20);
                          *(undefined8 *)(pBVar26 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30 + 8);
                          *(undefined8 *)(pBVar26 + 0x10) =
                               *(undefined8 *)(dctx->litExtraBuffer + lVar9 + 0x30);
                          *(undefined8 *)(pBVar26 + 0x18) = uVar5;
                          lVar9 = lVar9 + 0x20;
                        } while (pBVar26 + 0x20 < pBVar24);
                      }
                    }
                    local_220 = pBVar23 + uVar16;
                    pBVar26 = pBVar24 + -(long)pBVar28;
                    if (pBVar24 + -(long)pBVar19 < pBVar28) {
                      if (pBVar24 + -(long)local_200 < pBVar28) goto LAB_01d5fc64;
                      lVar9 = (long)(pBVar24 + -(long)pBVar28) - (long)pBVar19;
                      pBVar26 = local_210 + lVar9;
                      if (pBVar26 + sVar17 <= local_210) {
                        memmove(pBVar24,pBVar26,sVar17);
                        goto LAB_01d5f754;
                      }
                      memmove(pBVar24,pBVar26,-lVar9);
                      pBVar24 = pBVar24 + -lVar9;
                      sVar17 = sVar17 + lVar9;
                      pBVar26 = pBVar19;
                    }
                    if (pBVar28 < (BYTE *)0x10) {
                      if (pBVar28 < (BYTE *)0x8) {
                        iVar20 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                          ::dec64table + (long)pBVar28 * 4);
                        *pBVar24 = *pBVar26;
                        pBVar24[1] = pBVar26[1];
                        pBVar24[2] = pBVar26[2];
                        pBVar24[3] = pBVar26[3];
                        pBVar14 = pBVar26 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar28 * 4);
                        pBVar26 = pBVar26 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar28 * 4) - (long)iVar20);
                        *(undefined4 *)(pBVar24 + 4) = *(undefined4 *)pBVar14;
                      }
                      else {
                        *(undefined8 *)pBVar24 = *(undefined8 *)pBVar26;
                      }
                      if (8 < sVar17) {
                        pBVar28 = pBVar26 + 8;
                        pBVar14 = pBVar24 + 8;
                        if ((long)pBVar14 - (long)pBVar28 < 0x10) {
                          do {
                            *(undefined8 *)pBVar14 = *(undefined8 *)pBVar28;
                            pBVar14 = pBVar14 + 8;
                            pBVar28 = pBVar28 + 8;
                          } while (pBVar14 < pBVar24 + sVar17);
                        }
                        else {
                          uVar5 = *(undefined8 *)(pBVar26 + 0x10);
                          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar28;
                          *(undefined8 *)(pBVar24 + 0x10) = uVar5;
                          if (0x18 < (long)sVar17) {
                            lVar9 = 0;
                            do {
                              uVar5 = *(undefined8 *)(pBVar26 + lVar9 + 0x18 + 8);
                              pBVar28 = pBVar24 + lVar9 + 0x18;
                              *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar26 + lVar9 + 0x18);
                              *(undefined8 *)(pBVar28 + 8) = uVar5;
                              uVar5 = *(undefined8 *)(pBVar26 + lVar9 + 0x28 + 8);
                              *(undefined8 *)(pBVar28 + 0x10) =
                                   *(undefined8 *)(pBVar26 + lVar9 + 0x28);
                              *(undefined8 *)(pBVar28 + 0x18) = uVar5;
                              lVar9 = lVar9 + 0x20;
                            } while (pBVar28 + 0x20 < pBVar24 + sVar17);
                          }
                        }
                      }
                    }
                    else {
                      uVar5 = *(undefined8 *)(pBVar26 + 8);
                      *(undefined8 *)pBVar24 = *(undefined8 *)pBVar26;
                      *(undefined8 *)(pBVar24 + 8) = uVar5;
                      if (0x10 < (long)sVar17) {
                        lVar9 = 0x10;
                        do {
                          uVar5 = *(undefined8 *)(pBVar26 + lVar9 + 8);
                          pBVar28 = pBVar24 + lVar9;
                          *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar26 + lVar9);
                          *(undefined8 *)(pBVar28 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(pBVar26 + lVar9 + 0x10 + 8);
                          *(undefined8 *)(pBVar28 + 0x10) = *(undefined8 *)(pBVar26 + lVar9 + 0x10);
                          *(undefined8 *)(pBVar28 + 0x18) = uVar5;
                          lVar9 = lVar9 + 0x20;
                        } while (pBVar28 + 0x20 < pBVar24 + sVar17);
                      }
                    }
                  }
                  else {
                    sequence_04.matchLength = sVar17;
                    sequence_04.litLength = uVar16;
                    sequence_04.offset = (size_t)pBVar28;
                    local_220 = pBVar23;
                    local_168 = uVar16;
                    sStack_160 = sVar17;
                    local_158 = pBVar28;
                    uVar18 = ZSTD_execSequenceEnd
                                       (pBVar22,oend_00,sequence_04,&local_220,local_1e8,pBVar19,
                                        local_200,local_210);
                  }
LAB_01d5f754:
                  uVar7 = (uint)local_218;
                  if (0xffffffffffffff88 < uVar18) {
                    return uVar18;
                  }
                  pBVar22 = pBVar22 + uVar18;
                  local_1f8 = local_1e8;
                }
                else {
                  uVar16 = *puVar29;
                  sVar17 = auStack_f8[uVar18 * 3 + 1];
                  pBVar24 = (BYTE *)auStack_f8[uVar18 * 3 + 2];
                  pBVar28 = local_220 + uVar16;
                  if ((local_1f8 < pBVar28) ||
                     (pBVar26 = (BYTE *)(uVar16 + sVar17), local_1f0 < pBVar22 + (long)pBVar26)) {
                    sequence_02.matchLength = sVar17;
                    sequence_02.litLength = uVar16;
                    sequence_02.offset = (size_t)pBVar24;
                    local_168 = uVar16;
                    sStack_160 = sVar17;
                    local_158 = pBVar24;
                    pBVar26 = (BYTE *)ZSTD_execSequenceEnd
                                                (pBVar22,oend_00,sequence_02,&local_220,local_1f8,
                                                 pBVar19,local_200,local_210);
                  }
                  else {
                    pBVar14 = pBVar22 + uVar16;
                    uVar5 = *(undefined8 *)(local_220 + 8);
                    *(undefined8 *)pBVar22 = *(undefined8 *)local_220;
                    *(undefined8 *)(pBVar22 + 8) = uVar5;
                    if (0x10 < uVar16) {
                      uVar5 = *(undefined8 *)(local_220 + 0x18);
                      *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_220 + 0x10);
                      *(undefined8 *)(pBVar22 + 0x18) = uVar5;
                      if (0x10 < (long)(uVar16 - 0x10)) {
                        lVar9 = 0;
                        do {
                          uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x20 + 8);
                          pBVar30 = pBVar22 + lVar9 + 0x20;
                          *(undefined8 *)pBVar30 = *(undefined8 *)(local_220 + lVar9 + 0x20);
                          *(undefined8 *)(pBVar30 + 8) = uVar5;
                          uVar5 = *(undefined8 *)(local_220 + lVar9 + 0x30 + 8);
                          *(undefined8 *)(pBVar30 + 0x10) =
                               *(undefined8 *)(local_220 + lVar9 + 0x30);
                          *(undefined8 *)(pBVar30 + 0x18) = uVar5;
                          lVar9 = lVar9 + 0x20;
                        } while (pBVar30 + 0x20 < pBVar14);
                      }
                    }
                    pBVar30 = pBVar14 + -(long)pBVar24;
                    local_220 = pBVar28;
                    if (pBVar14 + -(long)pBVar19 < pBVar24) {
                      local_208 = pBVar26;
                      if (pBVar14 + -(long)local_200 < pBVar24) {
LAB_01d5f91e:
                        pBVar26 = (BYTE *)0xffffffffffffffec;
                      }
                      else {
                        lVar9 = (long)(pBVar14 + -(long)pBVar24) - (long)pBVar19;
                        pBVar28 = local_210 + lVar9;
                        if (local_210 < pBVar28 + sVar17) {
                          memmove(pBVar14,pBVar28,-lVar9);
                          pBVar14 = pBVar14 + -lVar9;
                          sVar17 = sVar17 + lVar9;
                          pBVar26 = local_208;
                          pBVar30 = pBVar19;
                          goto LAB_01d5f520;
                        }
                        memmove(pBVar14,pBVar28,sVar17);
                        pBVar26 = local_208;
                      }
                    }
                    else {
LAB_01d5f520:
                      if (pBVar24 < (BYTE *)0x10) {
                        if (pBVar24 < (BYTE *)0x8) {
                          iVar20 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec64table + (long)pBVar24 * 4);
                          *pBVar14 = *pBVar30;
                          pBVar14[1] = pBVar30[1];
                          pBVar14[2] = pBVar30[2];
                          pBVar14[3] = pBVar30[3];
                          pBVar28 = pBVar30 + *(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4);
                          pBVar30 = pBVar30 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + (long)pBVar24 * 4) - (long)iVar20);
                          *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar28;
                        }
                        else {
                          *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                        }
                        if (8 < sVar17) {
                          pBVar28 = pBVar30 + 8;
                          pBVar24 = pBVar14 + 8;
                          if ((long)pBVar24 - (long)pBVar28 < 0x10) {
                            do {
                              *(undefined8 *)pBVar24 = *(undefined8 *)pBVar28;
                              pBVar24 = pBVar24 + 8;
                              pBVar28 = pBVar28 + 8;
                            } while (pBVar24 < pBVar14 + sVar17);
                          }
                          else {
                            uVar5 = *(undefined8 *)(pBVar30 + 0x10);
                            *(undefined8 *)pBVar24 = *(undefined8 *)pBVar28;
                            *(undefined8 *)(pBVar14 + 0x10) = uVar5;
                            if (0x18 < (long)sVar17) {
                              lVar9 = 0;
                              do {
                                uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x18 + 8);
                                pBVar28 = pBVar14 + lVar9 + 0x18;
                                *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar30 + lVar9 + 0x18);
                                *(undefined8 *)(pBVar28 + 8) = uVar5;
                                uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x28 + 8);
                                *(undefined8 *)(pBVar28 + 0x10) =
                                     *(undefined8 *)(pBVar30 + lVar9 + 0x28);
                                *(undefined8 *)(pBVar28 + 0x18) = uVar5;
                                lVar9 = lVar9 + 0x20;
                              } while (pBVar28 + 0x20 < pBVar14 + sVar17);
                            }
                          }
                        }
                      }
                      else {
                        uVar5 = *(undefined8 *)(pBVar30 + 8);
                        *(undefined8 *)pBVar14 = *(undefined8 *)pBVar30;
                        *(undefined8 *)(pBVar14 + 8) = uVar5;
                        if (0x10 < (long)sVar17) {
                          lVar9 = 0x10;
                          do {
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 8);
                            pBVar28 = pBVar14 + lVar9;
                            *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar30 + lVar9);
                            *(undefined8 *)(pBVar28 + 8) = uVar5;
                            uVar5 = *(undefined8 *)(pBVar30 + lVar9 + 0x10 + 8);
                            *(undefined8 *)(pBVar28 + 0x10) =
                                 *(undefined8 *)(pBVar30 + lVar9 + 0x10);
                            *(undefined8 *)(pBVar28 + 0x18) = uVar5;
                            lVar9 = lVar9 + 0x20;
                          } while (pBVar28 + 0x20 < pBVar14 + sVar17);
                        }
                      }
                    }
                  }
LAB_01d5f719:
                  uVar7 = (uint)local_218;
                  if ((BYTE *)0xffffffffffffff88 < pBVar26) {
                    return (size_t)pBVar26;
                  }
                  pBVar22 = pBVar22 + (long)pBVar26;
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar7);
            }
            lVar9 = 0;
            do {
              (dctx->entropy).rep[lVar9] = *(U32 *)(local_180 + lVar9);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            ZVar6 = dctx->litBufferLocation;
            pBVar23 = local_1f8;
            goto LAB_01d5dc77;
          }
        }
      }
      else {
        local_1d8.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_1d8.bitContainer = *(BitContainerType *)local_1d8.ptr;
        if (local_1d8.bitContainer >> 0x38 != 0) {
          uVar27 = 0x1f;
          bVar1 = (byte)(local_1d8.bitContainer >> 0x38);
          if (bVar1 != 0) {
            for (; bVar1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
            }
          }
          local_1d8.bitsConsumed = ~uVar27 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_01d5dd57;
        }
      }
    }
LAB_01d5fc64:
    pBVar23 = (BYTE *)0xffffffffffffffec;
  }
  return (size_t)pBVar23;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}